

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void gimage::loadView(View *view,char *name,char *spath,bool verbose)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float *pfVar6;
  float **ppfVar7;
  float ***pppfVar8;
  View *this;
  int iVar9;
  int iVar10;
  PinholeCamera *this_00;
  ImageIO *pIVar11;
  size_type sVar12;
  size_type sVar13;
  size_type sVar14;
  long lVar15;
  size_type sVar16;
  long lVar17;
  long lVar18;
  size_t i;
  ulong uVar19;
  float fVar20;
  long local_198;
  long local_190;
  long local_188;
  float offset;
  float scale;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_158 [32];
  float *local_138;
  float **ppfStack_130;
  float ***local_128;
  View *local_120;
  long local_118;
  long local_110;
  float step;
  char *local_100;
  char *local_f8;
  string imagename;
  float inv;
  size_type local_c8;
  size_type sStack_c0;
  long local_b8;
  float *local_b0;
  float **ppfStack_a8;
  float ***local_a0;
  Properties prop;
  ImageU16 image2;
  
  local_f8 = spath;
  View::clear(view);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = name;
  std::__cxx11::string::string((string *)local_158,name,(allocator *)&inv);
  local_188 = 1;
  local_120 = view;
  gutil::split(&list,(string *)local_158,',',true);
  std::__cxx11::string::~string((string *)local_158);
  lVar15 = 0x20;
  local_190 = 0;
  local_118 = -1;
  local_110 = -1;
  local_198 = 0;
  for (uVar19 = 1;
      uVar19 < (ulong)((long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar19 = uVar19 + 1) {
    iVar9 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x3);
    if (iVar9 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_158,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      local_188 = atol((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::__cxx11::string::~string((string *)local_158);
    }
    iVar9 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x2);
    if (iVar9 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_158,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      local_198 = atol((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::__cxx11::string::~string((string *)local_158);
    }
    iVar9 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x2);
    if (iVar9 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_158,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      local_190 = atol((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::__cxx11::string::~string((string *)local_158);
    }
    iVar9 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x2);
    if (iVar9 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_158,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      local_110 = atol((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::__cxx11::string::~string((string *)local_158);
    }
    iVar9 = std::__cxx11::string::compare
                      ((long)&((list.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15,0,(char *)0x2);
    if (iVar9 == 0) {
      std::__cxx11::string::substr
                ((ulong)local_158,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15);
      local_118 = atol((char *)CONCAT44(local_158._4_4_,local_158._0_4_));
      std::__cxx11::string::~string((string *)local_158);
    }
    lVar15 = lVar15 + 0x20;
  }
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  loadViewProperties(&prop,local_100,local_f8,verbose);
  lVar18 = local_110;
  lVar15 = local_118;
  this = local_120;
  this_00 = (PinholeCamera *)operator_new(0x118);
  gmath::PinholeCamera::PinholeCamera(this_00,&prop,-1);
  step = 1.0;
  local_158._0_4_ = 1.0;
  gutil::Properties::getValue<float>(&prop,"step",&step,(float *)local_158);
  this->step = step;
  (*(this_00->super_Camera)._vptr_Camera[4])(this_00,local_188);
  if (lVar18 < 1) {
    lVar17 = 0;
    if (0 < (this_00->super_Camera).width) {
      lVar17 = local_198;
    }
    lVar18 = lVar18 - lVar17;
  }
  if (lVar15 < 1) {
    lVar17 = 0;
    if (0 < (this_00->super_Camera).height) {
      lVar17 = local_190;
    }
    lVar15 = lVar15 - lVar17;
  }
  (*(this_00->super_Camera)._vptr_Camera[5])(this_00,local_198,local_190,lVar18,lVar15);
  View::setCamera(this,(Camera *)this_00);
  (*(this_00->super_Camera)._vptr_Camera[1])(this_00);
  Image<float,_gimage::PixelTraits<float>_>::Image
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158,0,0,1);
  pIVar11 = getImageIO();
  iVar9 = (int)local_188;
  lVar17 = (long)iVar9;
  ImageIO::load(pIVar11,(ImageFloat *)local_158,
                ((list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,1,local_198 * lVar17
                ,local_190 * lVar17,lVar18 * lVar17,lVar17 * lVar15);
  gutil::Properties::getValue<float>(&prop,"disp.inv",&inv,(char *)0x0);
  sVar13 = 0;
  sVar12 = local_158._8_8_;
  if ((long)local_158._8_8_ < 1) {
    sVar12 = sVar13;
  }
  sVar14 = local_158._16_8_;
  if ((long)local_158._16_8_ < 1) {
    sVar14 = sVar13;
  }
  for (; sVar13 != sVar14; sVar13 = sVar13 + 1) {
    for (sVar16 = 0; sVar12 != sVar16; sVar16 = sVar16 + 1) {
      fVar20 = (*local_128)[sVar13][sVar16];
      if ((fVar20 == inv) && (!NAN(fVar20) && !NAN(inv))) {
        (*local_128)[sVar13][sVar16] = INFINITY;
      }
    }
  }
  if (1 < iVar9) {
    downscaleImage<float>
              ((Image<float,_gimage::PixelTraits<float>_> *)&inv,
               (Image<float,_gimage::PixelTraits<float>_> *)local_158,iVar9);
    pppfVar8 = local_128;
    ppfVar7 = ppfStack_130;
    pfVar6 = local_138;
    uVar5 = local_158._24_8_;
    uVar4 = local_158._16_8_;
    uVar3 = local_158._8_8_;
    uVar2 = local_158._0_4_;
    local_158._0_4_ = inv;
    inv = (float)uVar2;
    local_158._8_8_ = local_c8;
    local_158._16_8_ = sStack_c0;
    local_c8 = uVar3;
    sStack_c0 = uVar4;
    local_158._24_8_ = local_b8;
    local_b8 = uVar5;
    local_138 = local_b0;
    ppfStack_130 = ppfStack_a8;
    local_b0 = pfVar6;
    ppfStack_a8 = ppfVar7;
    local_128 = local_a0;
    local_a0 = pppfVar8;
    Image<float,_gimage::PixelTraits<float>_>::~Image
              ((Image<float,_gimage::PixelTraits<float>_> *)&inv);
  }
  gutil::Properties::getValue<float>(&prop,"disp.scale",&scale,"1");
  gutil::Properties::getValue<float>(&prop,"disp.offset",&offset,"0");
  if ((((1 < iVar9) || (scale != 1.0)) || (NAN(scale))) || ((offset != 0.0 || (NAN(offset))))) {
    fVar20 = 1.0;
    if (1 < iVar9) {
      fVar20 = 1.0 / (float)iVar9;
    }
    sVar13 = 0;
    sVar12 = local_158._8_8_;
    if ((long)local_158._8_8_ < 1) {
      sVar12 = sVar13;
    }
    sVar14 = local_158._16_8_;
    if ((long)local_158._16_8_ < 1) {
      sVar14 = sVar13;
    }
    for (; sVar13 != sVar14; sVar13 = sVar13 + 1) {
      for (sVar16 = 0; sVar12 != sVar16; sVar16 = sVar16 + 1) {
        fVar1 = (*local_128)[sVar13][sVar16];
        if ((uint)ABS(fVar1) < 0x7f800000) {
          (*local_128)[sVar13][sVar16] = (fVar1 * scale + offset) * fVar20;
        }
      }
    }
  }
  View::setDepthImage(this,(ImageFloat *)local_158);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158,0,0,0);
  imagename._M_dataplus._M_p = (pointer)&imagename.field_2;
  imagename._M_string_length = 0;
  imagename.field_2._M_local_buf[0] = '\0';
  iVar10 = getViewImageName(&imagename,local_100,local_f8,verbose);
  if (imagename._M_string_length != 0) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&inv,0,0,1);
    pIVar11 = getImageIO();
    lVar17 = (long)(iVar10 * iVar9);
    ImageIO::load(pIVar11,(ImageU8 *)&inv,imagename._M_dataplus._M_p,1,local_198 * lVar17,
                  local_190 * lVar17,lVar18 * lVar17,lVar17 * lVar15);
    View::setImage(this,(ImageU8 *)&inv);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&inv);
  }
  std::__cxx11::string::~string((string *)&imagename);
  Image<float,_gimage::PixelTraits<float>_>::~Image
            ((Image<float,_gimage::PixelTraits<float>_> *)local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&prop);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return;
}

Assistant:

void loadView(View &view, const char *name, const char *spath, bool verbose)
{
  view.clear();

  // get optionally specified downscale factor and image part

  int  ds=1;
  long x=0, y=0, w=-1, h=-1;
  std::vector<std::string> list;

  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 3, "ds=") == 0)
    {
      ds=atol(list[i].substr(3).c_str());
    }

    if (list[i].compare(0, 2, "x=") == 0)
    {
      x=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "y=") == 0)
    {
      y=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "w=") == 0)
    {
      w=atol(list[i].substr(2).c_str());
    }

    if (list[i].compare(0, 2, "h=") == 0)
    {
      h=atol(list[i].substr(2).c_str());
    }
  }

  // load camera

  gmath::Camera *camera=0;
  gutil::Properties prop;

  loadViewProperties(prop, name, spath, verbose);

  try
  {
    camera=new gmath::PinholeCamera(prop);
  }
  catch (gutil::Exception &ex)
  {
    try
    {
      camera=new gmath::OrthoCamera(prop);
    }
    catch (gutil::Exception &ex2)
    {
      if (verbose)
      {
        std::cout << "Cannot create pinhole camera from properties because: " << ex.what() << std::endl;
        std::cout << "Cannot create ortho camera from properties because: " << ex2.what() << std::endl;
      }

      throw gutil::IOException("Cannot create camera object from properties");
    }
  }

  // optionally set depth step from properties

  float step=1.0f;
  prop.getValue("step", step, 1.0f);
  view.setDepthStep(step);

  // set downscale factor and select part

  camera->setDownscaled(ds);

  if (w <= 0 && camera->getWidth() > 0)
  {
    w-=x;
  }

  if (h <= 0 && camera->getHeight() > 0)
  {
    h-=y;
  }

  camera->setPart(x, y, w, h);

  view.setCamera(camera);

  delete camera;
  camera=0;

  // load disparity

  ImageFloat depth;
  getImageIO().load(depth, list[0].c_str(), 1, ds*x, ds*y, ds*w, ds*h);

  // consider value for invalid pixels (inf is default)

  try
  {
    float inv;
    prop.getValue("disp.inv", inv);

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        if (depth.get(i, k, 0) == inv)
        {
          depth.setInvalid(i, k, 0);
        }
      }
    }
  }
  catch (const std::exception &)
  { }

  // optionally downscale image

  if (ds > 1)
  {
    depth=downscaleImage(depth, ds);
  }

  // get optional scale and offset

  float scale, offset;

  prop.getValue("disp.scale", scale, "1");
  prop.getValue("disp.offset", offset, "0");

  // apply scale, offset and downscale factor if any of them is not the default

  if (ds > 1 || scale != 1 || offset != 0)
  {
    float dscale=1;
    if (ds > 1)
    {
      dscale=1.0f/ds;
    }

    for (long k=0; k<depth.getHeight(); k++)
    {
      for (long i=0; i<depth.getWidth(); i++)
      {
        float *v=depth.getPtr(i, k, 0);

        if (depth.isValidS(*v))
        {
          depth.set(i, k, 0, (scale* *v+offset)*dscale);
        }

        v++;
      }
    }
  }

  // set depth image

  view.setDepthImage(depth);
  depth.setSize(0, 0, 0);

  // load image

  std::string imagename;
  int iscale=getViewImageName(imagename, name, spath, verbose);

  iscale*=ds;

  if (imagename.size() > 0)
  {
    ImageU8 image;

    try
    {
      getImageIO().load(image, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);
      view.setImage(image);
    }
    catch (gutil::Exception &)
    {
      // load 16 bit image and convert to 8 bit

      try
      {
        ImageU16 image2;
        getImageIO().load(image2, imagename.c_str(), 1, x*iscale, y*iscale, w*iscale, h*iscale);

        double s=image2.maxValue()/255.0;

        if (s != 0)
        {
          image2/=s;
        }

        image.setImageLimited(image2);
        image2.setSize(0, 0, 0);

        view.setImage(image);
      }
      catch (gutil::Exception &ex)
      {
        if (verbose)
        {
          std::cout << "Cannot load image: " << imagename << " (" << ex.what() << ")" << std::endl;
        }
      }
    }
  }
}